

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O3

void shim_vkDestroyDevice(VkDevice device,VkAllocationCallbacks *pAllocator)

{
  long lVar1;
  pointer pPVar2;
  __normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_> __dest
  ;
  VkDevice_T **ppVVar3;
  vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_> *this;
  pointer pPVar4;
  VkDevice_T **__src;
  VkDevice local_28;
  
  pPVar2 = mock.physical_devices_details.
           super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (mock.physical_devices_details.
      super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      mock.physical_devices_details.
      super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this = &(mock.physical_devices_details.
             super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
             ._M_impl.super__Vector_impl_data._M_start)->created_device_details;
    local_28 = device;
    do {
      __dest = std::
               __find_if<__gnu_cxx::__normal_iterator<VkDevice_T**,std::vector<VkDevice_T*,std::allocator<VkDevice_T*>>>,__gnu_cxx::__ops::_Iter_equals_val<VkDevice_T*const>>
                         (*(undefined8 *)(this + -0x18),*(undefined8 *)(this + -0x10),&local_28);
      ppVVar3 = *(VkDevice_T ***)(this + -0x10);
      if (__dest._M_current != ppVVar3) {
        lVar1 = *(long *)(this + -0x18);
        __src = __dest._M_current + 1;
        if (__src != ppVVar3) {
          memmove(__dest._M_current,__src,(long)ppVVar3 - (long)__src);
          ppVVar3 = *(VkDevice_T ***)(this + -0x10);
        }
        *(VkDevice_T ***)(this + -0x10) = ppVVar3 + -1;
        std::
        vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
        ::_M_erase(this,(CreatedDeviceDetails *)
                        (((long)__dest._M_current - lVar1 >> 3) * 0x110 + *(long *)this));
      }
      pPVar4 = (pointer)(this + 0x18);
      this = this + 0x698;
    } while (pPVar4 != pPVar2);
  }
  return;
}

Assistant:

VKAPI_ATTR void VKAPI_CALL shim_vkDestroyDevice(
    [[maybe_unused]] VkDevice device, [[maybe_unused]] const VkAllocationCallbacks* pAllocator) {
    for (auto& physical_devices : mock.physical_devices_details) {
        auto it = std::find(
            std::begin(physical_devices.created_device_handles), std::end(physical_devices.created_device_handles), device);
        if (it != std::end(physical_devices.created_device_handles)) {
            auto index = it - physical_devices.created_device_handles.begin();
            physical_devices.created_device_handles.erase(it);
            physical_devices.created_device_details.erase(physical_devices.created_device_details.begin() + index);
        }
    }
}